

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

void __thiscall p2t::Edge::Edge(Edge *this,Point *p1,Point *p2)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  runtime_error *this_00;
  allocator local_39;
  Edge *local_38 [4];
  
  this->p = p1;
  this->q = p2;
  dVar2 = p1->y;
  pdVar1 = &p2->y;
  if (dVar2 < *pdVar1 || dVar2 == *pdVar1) {
    if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) goto LAB_0058c301;
    dVar2 = p1->x;
    bVar3 = dVar2 == p2->x;
    if (dVar2 < p2->x || bVar3) {
      if ((bVar3) && (!NAN(dVar2) && !NAN(p2->x))) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)local_38,"repeat points",&local_39);
        std::runtime_error::runtime_error(this_00,(string *)local_38);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0058c301;
    }
  }
  this->q = p1;
  this->p = p2;
  p2 = p1;
LAB_0058c301:
  local_38[0] = this;
  std::vector<p2t::Edge*,std::allocator<p2t::Edge*>>::emplace_back<p2t::Edge*>
            ((vector<p2t::Edge*,std::allocator<p2t::Edge*>> *)&p2->edge_list,local_38);
  return;
}

Assistant:

Edge(Point& p1, Point& p2) : p(&p1), q(&p2)
  {
    if (p1.y > p2.y) {
      q = &p1;
      p = &p2;
    } else if (p1.y == p2.y) {
      if (p1.x > p2.x) {
        q = &p1;
        p = &p2;
      } else if (p1.x == p2.x) {
        // Repeat points
        // ASSIMP_CHANGE (aramis_acg)
        throw std::runtime_error(std::string("repeat points"));
        //assert(false);
      }
    }

    q->edge_list.push_back(this);
  }